

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall cmComputeLinkInformation::ComputeLinkTypeInfo(cmComputeLinkInformation *this)

{
  cmState *this_00;
  cmGeneratorTarget *this_01;
  bool bVar1;
  TargetType TVar2;
  char *pcVar3;
  char *pcVar4;
  allocator local_61;
  string static_link_type_flag_var;
  string shared_link_type_flag_var;
  
  this_00 = this->CMakeInstance->State;
  std::__cxx11::string::string
            ((string *)&static_link_type_flag_var,"TARGET_ARCHIVES_MAY_BE_SHARED_LIBS",
             (allocator *)&shared_link_type_flag_var);
  bVar1 = cmState::GetGlobalPropertyAsBool(this_00,&static_link_type_flag_var);
  this->ArchivesMayBeShared = bVar1;
  std::__cxx11::string::~string((string *)&static_link_type_flag_var);
  this->LinkTypeEnabled = false;
  TVar2 = cmGeneratorTarget::GetType(this->Target);
  if (((TVar2 == EXECUTABLE) || (TVar2 == SHARED_LIBRARY)) || (TVar2 == MODULE_LIBRARY)) {
    std::__cxx11::string::string
              ((string *)&static_link_type_flag_var,"CMAKE_",(allocator *)&shared_link_type_flag_var
              );
    std::__cxx11::string::append((char *)&static_link_type_flag_var);
    std::__cxx11::string::append((char *)&static_link_type_flag_var);
    std::__cxx11::string::append((string *)&static_link_type_flag_var);
    std::__cxx11::string::append((char *)&static_link_type_flag_var);
    pcVar3 = cmMakefile::GetDefinition(this->Makefile,&static_link_type_flag_var);
    std::__cxx11::string::string((string *)&shared_link_type_flag_var,"CMAKE_",&local_61);
    std::__cxx11::string::append((char *)&shared_link_type_flag_var);
    std::__cxx11::string::append((char *)&shared_link_type_flag_var);
    std::__cxx11::string::append((string *)&shared_link_type_flag_var);
    std::__cxx11::string::append((char *)&shared_link_type_flag_var);
    pcVar4 = cmMakefile::GetDefinition(this->Makefile,&shared_link_type_flag_var);
    std::__cxx11::string::~string((string *)&shared_link_type_flag_var);
    std::__cxx11::string::~string((string *)&static_link_type_flag_var);
    if (((pcVar3 != (char *)0x0) && (pcVar4 != (char *)0x0)) &&
       ((*pcVar3 != '\0' && (*pcVar4 != '\0')))) {
      this->LinkTypeEnabled = true;
      std::__cxx11::string::assign((char *)&this->StaticLinkTypeFlag);
      std::__cxx11::string::assign((char *)&this->SharedLinkTypeFlag);
    }
  }
  this_01 = this->Target;
  std::__cxx11::string::string
            ((string *)&static_link_type_flag_var,"LINK_SEARCH_START_STATIC",
             (allocator *)&shared_link_type_flag_var);
  pcVar3 = cmGeneratorTarget::GetProperty(this_01,&static_link_type_flag_var);
  std::__cxx11::string::~string((string *)&static_link_type_flag_var);
  bVar1 = cmSystemTools::IsOn(pcVar3);
  this->StartLinkType = LinkShared - bVar1;
  this->CurrentLinkType = LinkShared - bVar1;
  return;
}

Assistant:

void cmComputeLinkInformation::ComputeLinkTypeInfo()
{
  // Check whether archives may actually be shared libraries.
  this->ArchivesMayBeShared = this->CMakeInstance->GetState()
              ->GetGlobalPropertyAsBool("TARGET_ARCHIVES_MAY_BE_SHARED_LIBS");

  // First assume we cannot do link type stuff.
  this->LinkTypeEnabled = false;

  // Lookup link type selection flags.
  const char* static_link_type_flag = 0;
  const char* shared_link_type_flag = 0;
  const char* target_type_str = 0;
  switch(this->Target->GetType())
    {
    case cmState::EXECUTABLE:     target_type_str = "EXE"; break;
    case cmState::SHARED_LIBRARY: target_type_str = "SHARED_LIBRARY"; break;
    case cmState::MODULE_LIBRARY: target_type_str = "SHARED_MODULE"; break;
    default: break;
    }
  if(target_type_str)
    {
    std::string static_link_type_flag_var = "CMAKE_";
    static_link_type_flag_var += target_type_str;
    static_link_type_flag_var += "_LINK_STATIC_";
    static_link_type_flag_var += this->LinkLanguage;
    static_link_type_flag_var += "_FLAGS";
    static_link_type_flag =
      this->Makefile->GetDefinition(static_link_type_flag_var);

    std::string shared_link_type_flag_var = "CMAKE_";
    shared_link_type_flag_var += target_type_str;
    shared_link_type_flag_var += "_LINK_DYNAMIC_";
    shared_link_type_flag_var += this->LinkLanguage;
    shared_link_type_flag_var += "_FLAGS";
    shared_link_type_flag =
      this->Makefile->GetDefinition(shared_link_type_flag_var);
    }

  // We can support link type switching only if all needed flags are
  // known.
  if(static_link_type_flag && *static_link_type_flag &&
     shared_link_type_flag && *shared_link_type_flag)
    {
    this->LinkTypeEnabled = true;
    this->StaticLinkTypeFlag = static_link_type_flag;
    this->SharedLinkTypeFlag = shared_link_type_flag;
    }

  // Lookup the starting link type from the target (linked statically?).
  const char* lss =
      this->Target->GetProperty("LINK_SEARCH_START_STATIC");
  this->StartLinkType = cmSystemTools::IsOn(lss)? LinkStatic : LinkShared;
  this->CurrentLinkType = this->StartLinkType;
}